

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_Mesh::ConvertQuadsToTriangles(ON_Mesh *this)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = false;
  ConvertNonPlanarQuadsToTriangles(this,-1.23432101234321e+308,-1.23432101234321e+308,1,false);
  iVar1 = QuadCount(this);
  if (iVar1 == 0) {
    QuadCount(this);
    bVar2 = this->m_triangle_count == (this->m_F).m_count;
  }
  return bVar2;
}

Assistant:

bool ON_Mesh::ConvertQuadsToTriangles()
{
  double planar_tolerance = ON_UNSET_VALUE;
  double angle_tolerance_radians = ON_UNSET_VALUE;
  unsigned int split_method = 1;

  ConvertNonPlanarQuadsToTriangles(
    planar_tolerance, 
    angle_tolerance_radians,
    split_method
  );

  return ( QuadCount() == 0 && TriangleCount() == FaceCount() ) ? true : false;
}